

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

void __thiscall asl::SocketServer::~SocketServer(SocketServer *this)

{
  int in_EDX;
  __pid_t in_ESI;
  
  this->_vptr_SocketServer = (_func_int **)&PTR_serve_00154870;
  if (this->_thread != (SockServerThread *)0x0) {
    Thread::kill(&this->_thread->super_Thread,in_ESI,in_EDX);
    if (this->_thread != (SockServerThread *)0x0) {
      (*(this->_thread->super_Thread)._vptr_Thread[1])();
    }
  }
  String::~String(&this->_socketError);
  Sockets::~Sockets(&this->_sockets);
  return;
}

Assistant:

SocketServer::~SocketServer()
{
	if(_thread) {
		_thread->kill();
		delete _thread;
	}
}